

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addressOperations.cpp
# Opt level: O1

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *
gmlc::networking::extractInterfaceAndPort
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           *__return_storage_ptr__,string *address)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  ulong uVar3;
  pointer pcVar4;
  _Alloc_hider __nptr;
  int *piVar5;
  long lVar6;
  size_type __n;
  ulong uVar7;
  undefined1 auVar8 [12];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  int local_40;
  char *local_38;
  
  paVar1 = &(__return_storage_ptr__->first).field_2;
  (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)paVar1;
  (__return_storage_ptr__->first)._M_string_length = 0;
  (__return_storage_ptr__->first).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->second = 0;
  uVar3 = address->_M_string_length;
  if (uVar3 == 0) {
LAB_003cfe7f:
    __n = 0xffffffffffffffff;
  }
  else {
    uVar7 = uVar3;
    do {
      __n = uVar7 - 1;
      if (uVar7 == 0) goto LAB_003cfe7f;
      lVar6 = uVar7 - 1;
      uVar7 = __n;
    } while ((address->_M_dataplus)._M_p[lVar6] != ':');
  }
  if (__n == 0xffffffffffffffff) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    pcVar4 = (address->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)&local_60,pcVar4,pcVar4 + uVar3);
  }
  else {
    uVar7 = __n + 1;
    if ((uVar7 < uVar3) && ((address->_M_dataplus)._M_p[uVar7] != '/')) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)address,uVar7,
                 0xffffffffffffffff);
      __nptr._M_p = local_60._M_dataplus._M_p;
      piVar5 = __errno_location();
      iVar2 = *piVar5;
      *piVar5 = 0;
      lVar6 = strtol(__nptr._M_p,&local_38,10);
      if (local_38 == __nptr._M_p) {
        std::__throw_invalid_argument("stoi");
      }
      else if (((int)lVar6 == lVar6) && (*piVar5 != 0x22)) {
        if (*piVar5 == 0) {
          *piVar5 = iVar2;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)address,0,
                   __n);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        __return_storage_ptr__->second = (int)lVar6;
        return __return_storage_ptr__;
      }
      auVar8 = std::__throw_out_of_range("stoi");
      if (auVar8._8_4_ == 1) {
        __cxa_begin_catch(auVar8._0_8_);
        pcVar4 = (address->_M_dataplus)._M_p;
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_60,pcVar4,pcVar4 + address->_M_string_length);
        local_40 = -1;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,&local_60);
        __return_storage_ptr__->second = local_40;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        __cxa_end_catch();
        return __return_storage_ptr__;
      }
      pcVar4 = (__return_storage_ptr__->first)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar4 != paVar1) {
        operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
      }
      _Unwind_Resume(auVar8._0_8_);
    }
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    pcVar4 = (address->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)&local_60,pcVar4,pcVar4 + uVar3);
  }
  local_40 = -1;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,&local_60);
  __return_storage_ptr__->second = local_40;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, int> extractInterfaceAndPort(const std::string& address)
{
    std::pair<std::string, int> ret;
    auto lastColon = address.find_last_of(':');
    if (lastColon == std::string::npos) {
        ret = std::make_pair(address, -1);
    } else {
        try {
            if ((address.size() > lastColon + 1) &&
                (address[lastColon + 1] != '/')) {
                auto val = std::stoi(address.substr(lastColon + 1));
                ret.first = address.substr(0, lastColon);
                ret.second = val;
            } else {
                ret = std::make_pair(address, -1);
            }
        }
        catch (const std::invalid_argument&) {
            ret = std::make_pair(address, -1);
        }
    }

    return ret;
}